

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipcmp.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int c;
  char **argv_local;
  int argc_local;
  
  progname = *argv;
  ignore_case = 0;
  test_files = 0;
  paranoid = 0;
  verbose = 1;
  while (iVar1 = getopt(argc,argv,"hVipqtv"), iVar1 != -1) {
    switch(iVar1) {
    case 0x56:
      fputs(version_string,_stdout);
      exit(0);
    default:
      fprintf(_stderr,"usage: %s [-hipqtVv] archive1 archive2\n",progname);
      exit(2);
    case 0x68:
      fputs(help_head,_stdout);
      printf("usage: %s [-hipqtVv] archive1 archive2\n",progname);
      fputs(help,_stdout);
      exit(0);
    case 0x69:
      ignore_case = 1;
      break;
    case 0x70:
      paranoid = 1;
      break;
    case 0x71:
      verbose = 0;
      break;
    case 0x74:
      test_files = 1;
      break;
    case 0x76:
      verbose = 1;
    }
  }
  if (argc != _optind + 2) {
    fprintf(_stderr,"usage: %s [-hipqtVv] archive1 archive2\n",progname);
    exit(2);
  }
  iVar1 = compare_zip(argv + _optind);
  exit((uint)(iVar1 != 0));
}

Assistant:

int
main(int argc, char *const argv[]) {
    int c;

    progname = argv[0];

    ignore_case = 0;
    test_files = 0;
    paranoid = 0;
    verbose = 1;

    while ((c = getopt(argc, argv, OPTIONS)) != -1) {
	switch (c) {
	case 'i':
	    ignore_case = 1;
	    break;
	case 'p':
	    paranoid = 1;
	    break;
	case 'q':
	    verbose = 0;
	    break;
	case 't':
	    test_files = 1;
	    break;
	case 'v':
	    verbose = 1;
	    break;

	case 'h':
	    fputs(help_head, stdout);
	    printf(USAGE, progname);
	    fputs(help, stdout);
	    exit(0);
	case 'V':
	    fputs(version_string, stdout);
	    exit(0);

	default:
	    fprintf(stderr, USAGE, progname);
	    exit(2);
	}
    }

    if (argc != optind + 2) {
	fprintf(stderr, USAGE, progname);
	exit(2);
    }

    exit((compare_zip(argv + optind) == 0) ? 0 : 1);
}